

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  JSAMPROW pJVar6;
  ulong uVar7;
  ulong uVar8;
  JSAMPROW pJVar9;
  ulong uVar10;
  
  uVar1 = cinfo->num_components;
  uVar5 = (ulong)cinfo->output_width;
  if ((long)(int)uVar1 == 3) {
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar9 = input_buf[1][input_row];
      pJVar3 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *pJVar6 = pJVar2[uVar8];
        pJVar6[1] = pJVar9[uVar8];
        pJVar6[2] = pJVar3[uVar8];
        pJVar6 = pJVar6 + 3;
      }
      output_buf = output_buf + 1;
    }
  }
  else if (uVar1 == 4) {
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar9 = input_buf[1][input_row];
      pJVar3 = input_buf[2][input_row];
      pJVar6 = input_buf[3][input_row];
      input_row = input_row + 1;
      pJVar4 = *output_buf;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        pJVar4[uVar8 * 4] = pJVar2[uVar8];
        pJVar4[uVar8 * 4 + 1] = pJVar9[uVar8];
        pJVar4[uVar8 * 4 + 2] = pJVar3[uVar8];
        pJVar4[uVar8 * 4 + 3] = pJVar6[uVar8];
      }
      output_buf = output_buf + 1;
    }
  }
  else {
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pJVar2 = input_buf[uVar7][input_row];
        pJVar9 = *output_buf + uVar7;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          *pJVar9 = pJVar2[uVar10];
          pJVar9 = pJVar9 + (int)uVar1;
        }
      }
      output_buf = output_buf + 1;
      input_row = input_row + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
             JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr, outptr0, outptr1, outptr2, outptr3;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  if (nc == 3) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
      }
    }
  } else if (nc == 4) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      outptr3 = output_buf[3][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
        outptr3[col] = *inptr++;
      }
    }
  } else {
    while (--num_rows >= 0) {
      /* It seems fastest to make a separate pass for each component. */
      for (ci = 0; ci < nc; ci++) {
        inptr = *input_buf;
        outptr = output_buf[ci][output_row];
        for (col = 0; col < num_cols; col++) {
          outptr[col] = inptr[ci];
          inptr += nc;
        }
      }
      input_buf++;
      output_row++;
    }
  }
}